

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O3

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DefaultSecretGenerator::CreateDefaultEntryInternal
          (DefaultSecretGenerator *this,string *entry_name)

{
  pointer pcVar1;
  Catalog *catalog;
  bool bVar2;
  iterator __it;
  SecretCatalogEntry *this_00;
  pointer pSVar3;
  pointer pSVar4;
  IOException *this_01;
  SerializationException *this_02;
  key_type *in_RDX;
  LocalFileSystem fs;
  string secret_path;
  string base_secret_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  _Head_base<0UL,_duckdb::SecretCatalogEntry_*,_false> local_440;
  undefined1 local_438 [8];
  FileSystem local_430;
  unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
  local_428;
  string local_420;
  BufferedFileReader local_400;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [160];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  undefined1 local_2f0 [16];
  string local_2e0;
  BinaryDeserializer local_2c0;
  
  __it = ::std::
         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(entry_name + 1),in_RDX);
  if (__it.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    (this->super_DefaultGenerator)._vptr_DefaultGenerator = (_func_int **)0x0;
  }
  else {
    local_430._vptr_FileSystem = (_func_int **)&PTR__FileSystem_0196e5c8;
    (**(code **)(**(long **)((long)&entry_name->field_2 + 8) + 0x50))(&local_2e0);
    local_2c0.super_Deserializer._vptr_Deserializer =
         (_func_int **)&local_2c0.super_Deserializer.data;
    pcVar1 = (in_RDX->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c0,pcVar1,pcVar1 + in_RDX->_M_string_length);
    ::std::__cxx11::string::append((char *)&local_2c0);
    FileSystem::JoinPath(&local_420,&local_430,&local_2e0,(string *)&local_2c0);
    if ((SerializationData *)local_2c0.super_Deserializer._vptr_Deserializer !=
        &local_2c0.super_Deserializer.data) {
      operator_delete(local_2c0.super_Deserializer._vptr_Deserializer);
    }
    BufferedFileReader::BufferedFileReader
              (&local_400,&local_430,local_420._M_dataplus._M_p,READ_LOCK,
               (optional_ptr<duckdb::FileOpener,_true>)0x0);
    bVar2 = LocalFileSystem::IsPrivateFile(&local_420,(FileOpener *)0x0);
    if (!bVar2) {
      this_01 = (IOException *)__cxa_allocate_exception(0x10);
      local_2c0.super_Deserializer._vptr_Deserializer =
           (_func_int **)&local_2c0.super_Deserializer.data;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c0,
                 "The secret file \'%s\' has incorrect permissions! Please set correct permissions or remove file"
                 ,"");
      local_300._M_allocated_capacity = (size_type)local_2f0;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_300,local_420._M_dataplus._M_p,
                 (char *)((long)(__pthread_internal_list **)local_420._M_string_length +
                         (long)local_420._M_dataplus._M_p));
      IOException::IOException<std::__cxx11::string>
                (this_01,(string *)&local_2c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_300);
      __cxa_throw(this_01,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar2 = BufferedFileReader::Finished(&local_400);
    if (bVar2) {
      local_400.super_ReadStream._vptr_ReadStream = (_func_int **)&PTR_ReadData_01967730;
      if ((_Head_base<0UL,_duckdb::FileHandle_*,_false>)
          local_400.handle.
          super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
          super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
          super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl !=
          (_Head_base<0UL,_duckdb::FileHandle_*,_false>)0x0) {
        (*(*(_func_int ***)
            local_400.handle.
            super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
            super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
            super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl)[1])();
      }
      local_400.handle.
      super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
      super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
      super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)
           (__uniq_ptr_data<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true,_true>
           )0x0;
      if (local_400.data.super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>.
          _M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
          (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)0x0) {
        operator_delete__((void *)local_400.data.
                                  super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                  .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      }
      this_02 = (SerializationException *)__cxa_allocate_exception(0x10);
      local_2c0.super_Deserializer._vptr_Deserializer =
           (_func_int **)&local_2c0.super_Deserializer.data;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c0,
                 "Failed to deserialize secret \'%s\' from \'%s\': file appears empty! Please remove the file, restart and try again"
                 ,"");
      local_3a0._0_8_ = local_3a0 + 0x10;
      pcVar1 = (in_RDX->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_3a0,pcVar1,pcVar1 + in_RDX->_M_string_length);
      local_3c0._0_8_ = local_3c0 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_3c0,local_420._M_dataplus._M_p,
                 (char *)((long)(__pthread_internal_list **)local_420._M_string_length +
                         (long)local_420._M_dataplus._M_p));
      SerializationException::SerializationException<std::__cxx11::string,std::__cxx11::string>
                (this_02,(string *)&local_2c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
      __cxa_throw(this_02,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_2c0.super_Deserializer._vptr_Deserializer = (_func_int **)&PTR__Deserializer_01967a98;
    local_2c0.super_Deserializer.deserialize_enum_from_string = false;
    SerializationData::SerializationData(&local_2c0.super_Deserializer.data);
    local_2c0.super_Deserializer._vptr_Deserializer = (_func_int **)&PTR__Deserializer_019678f8;
    local_2c0.nesting_level = 0;
    local_2c0.has_buffered_field = false;
    local_2c0.buffered_field = 0;
    local_2c0.super_Deserializer.deserialize_enum_from_string = false;
    local_2c0.stream = &local_400.super_ReadStream;
    BinaryDeserializer::OnObjectBegin(&local_2c0);
    SecretManager::DeserializeSecret
              ((SecretManager *)local_438,*(Deserializer **)((long)&entry_name->field_2 + 8),
               (string *)&local_2c0);
    BinaryDeserializer::OnObjectEnd(&local_2c0);
    catalog = (Catalog *)entry_name->_M_string_length;
    this_00 = (SecretCatalogEntry *)operator_new(0xe8);
    local_428.
    super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>._M_t.
    super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>.
    _M_t.
    super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
    .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl =
         (unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>)
         (unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>)
         local_438;
    local_438 = (undefined1  [8])0x0;
    SecretCatalogEntry::SecretCatalogEntry(this_00,&local_428,catalog);
    local_440._M_head_impl = this_00;
    if (local_428.
        super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>.
        _M_t.
        super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
        .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl !=
        (__uniq_ptr_data<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true,_true>
         )0x0) {
      (**(code **)(*(_func_int **)
                    local_428.
                    super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                    .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl + 8))();
    }
    pSVar3 = unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
             ::operator->((unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
                           *)&local_440);
    pSVar4 = unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>::
             operator->(&pSVar3->secret);
    ::std::__cxx11::string::_M_replace
              ((ulong)&pSVar4->storage_mode,0,(char *)(pSVar4->storage_mode)._M_string_length,
               0x1343f1f);
    pSVar3 = unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
             ::operator->((unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
                           *)&local_440);
    pSVar4 = unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>::
             operator->(&pSVar3->secret);
    pSVar4->persist_type = PERSISTENT;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::erase((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)(entry_name + 1),
            (const_iterator)
            __it.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur);
    (this->super_DefaultGenerator)._vptr_DefaultGenerator = (_func_int **)local_440._M_head_impl;
    if (local_438 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_438 + 8))();
    }
    Deserializer::~Deserializer(&local_2c0.super_Deserializer);
    local_400.super_ReadStream._vptr_ReadStream = (_func_int **)&PTR_ReadData_01967730;
    if (local_400.handle.
        super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
        super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
        super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true,_true>)
        0x0) {
      (**(code **)(*(long *)local_400.handle.
                            super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>
                            .super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl + 8))()
      ;
    }
    local_400.handle.super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>.
    _M_t.super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
    super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)
         (__uniq_ptr_data<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true,_true>)
         0x0;
    if ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
        local_400.data.super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t
        .super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
      operator_delete__((void *)local_400.data.
                                super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                ._M_t.
                                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    FileSystem::~FileSystem(&local_430);
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> DefaultSecretGenerator::CreateDefaultEntryInternal(const string &entry_name) {
	auto secret_lu = persistent_secrets.find(entry_name);
	if (secret_lu == persistent_secrets.end()) {
		return nullptr;
	}

	LocalFileSystem fs;

	string base_secret_path = secret_manager.PersistentSecretPath();
	string secret_path = fs.JoinPath(base_secret_path, entry_name + ".duckdb_secret");

	// Note each file should contain 1 secret
	try {
		auto file_reader = BufferedFileReader(fs, secret_path.c_str());

		if (!LocalFileSystem::IsPrivateFile(secret_path, nullptr)) {
			throw IOException(
			    "The secret file '%s' has incorrect permissions! Please set correct permissions or remove file",
			    secret_path);
		}

		if (!file_reader.Finished()) {
			BinaryDeserializer deserializer(file_reader);

			deserializer.Begin();
			auto deserialized_secret = secret_manager.DeserializeSecret(deserializer, secret_path);
			deserializer.End();

			auto entry = make_uniq<SecretCatalogEntry>(std::move(deserialized_secret), catalog);
			entry->secret->storage_mode = SecretManager::LOCAL_FILE_STORAGE_NAME;
			entry->secret->persist_type = SecretPersistType::PERSISTENT;

			// Finally: we remove the default entry from the persistent_secrets, otherwise we aren't able to drop it
			// later
			persistent_secrets.erase(secret_lu);

			return std::move(entry);
		}
	} catch (std::exception &ex) {
		ErrorData error(ex);
		switch (error.Type()) {
		case ExceptionType::SERIALIZATION:
			throw SerializationException(
			    "Failed to deserialize the persistent secret file: '%s'. The file maybe be "
			    "corrupt, please remove the file, restart and try again. (error message: '%s')",
			    secret_path, error.RawMessage());
		case ExceptionType::IO:
			throw IOException(
			    "Failed to open the persistent secret file: '%s'. Some other process may have removed it, "
			    "please restart and try again. (error message: '%s')",
			    secret_path, error.RawMessage());
		default:
			throw;
		}
	}

	throw SerializationException("Failed to deserialize secret '%s' from '%s': file appears empty! Please remove the "
	                             "file, restart and try again",
	                             entry_name, secret_path);
}